

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finitediff.cpp
# Opt level: O1

bool fd::compare_jacobian
               (Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *x,
               Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *y,
               double test_eps,string *msg)

{
  PointerType pdVar1;
  PointerType pdVar2;
  source_loc loc;
  bool bVar3;
  logger *this;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  string_view_t fmt;
  double local_70;
  double abs_diff;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double test_eps_local;
  long local_38;
  
  local_38 = 0;
  if ((x->
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value < 1) {
    bVar3 = true;
  }
  else {
    bVar3 = true;
    local_48 = test_eps;
    do {
      test_eps_local = 0.0;
      if (0 < (x->
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_cols.m_value) {
        do {
          lVar5 = (x->
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).m_stride.m_outer.m_value * (long)test_eps_local;
          pdVar1 = (x->
                   super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   ).
                   super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_data;
          lVar4 = (long)test_eps_local *
                  (y->
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).m_stride.m_outer.m_value;
          pdVar2 = (y->
                   super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   ).
                   super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_data;
          dVar7 = ABS(pdVar2[lVar4 + local_38]);
          if (ABS(pdVar2[lVar4 + local_38]) <= ABS(pdVar1[lVar5 + local_38])) {
            dVar7 = ABS(pdVar1[lVar5 + local_38]);
          }
          dVar6 = pdVar1[lVar5 + local_38] - pdVar2[lVar4 + local_38];
          dVar8 = 1.0;
          if (1.0 <= dVar7) {
            dVar8 = dVar7;
          }
          local_70 = ABS(dVar6);
          if (dVar8 * local_48 < local_70) {
            abs_diff = pdVar1[lVar5 + local_38];
            local_60 = pdVar2[lVar4 + local_38];
            local_58 = ABS(dVar6 / pdVar1[lVar5 + local_38]);
            local_50 = ABS(dVar6 / pdVar2[lVar4 + local_38]);
            this = spdlog::default_logger_raw();
            loc.funcname = (char *)0x0;
            loc.filename = (char *)0x0;
            loc.line = 0;
            loc._12_4_ = 0;
            fmt.size_ = 0x57;
            fmt.data_ = 
            "{} eps={:.3e} r={} c={} x={:.3e} y={:.3e} |x-y|={:.3e} |x-y|/|x|={:.3e} |x-y|/|y|={:3e}"
            ;
            spdlog::logger::
            log_<std::__cxx11::string_const&,double_const&,long&,long&,double,double,double&,double,double>
                      (this,loc,debug,fmt,msg,&local_48,&local_38,(long *)&test_eps_local,&abs_diff,
                       &local_60,&local_70,&local_58,&local_50);
            bVar3 = false;
          }
          test_eps_local = (double)((long)test_eps_local + 1);
        } while ((long)test_eps_local <
                 (x->
                 super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_cols.m_value);
      }
      local_38 = local_38 + 1;
    } while (local_38 <
             (x->
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value);
  }
  return bVar3;
}

Assistant:

bool compare_jacobian(
    const Eigen::Ref<const Eigen::MatrixXd>& x,
    const Eigen::Ref<const Eigen::MatrixXd>& y,
    const double test_eps,
    const std::string& msg)
{
    assert(x.rows() == y.rows());
    assert(x.cols() == y.cols());

    bool same = true;
    for (long i = 0; i < x.rows(); i++) {
        for (long j = 0; j < x.cols(); j++) {
            double scale = std::max(
                std::max(std::abs(x(i, j)), std::abs(y(i, j))), double(1.0));

            double abs_diff = std::abs(x(i, j) - y(i, j));

            if (abs_diff > test_eps * scale) {
                spdlog::debug(
                    "{} eps={:.3e} r={} c={} x={:.3e} y={:.3e} "
                    "|x-y|={:.3e} |x-y|/|x|={:.3e} |x-y|/|y|={:3e}",
                    msg, test_eps, i, j, x(i, j), y(i, j), abs_diff,
                    abs_diff / std::abs(x(i, j)), abs_diff / std::abs(y(i, j)));
                same = false;
            }
        }
    }
    return same;
}